

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O0

ElementPtr __thiscall Rml::Element::Clone(Element *this)

{
  ElementInstancer *pEVar1;
  bool bVar2;
  String *pSVar3;
  String *tag;
  pointer pEVar4;
  ElementStyle *pEVar5;
  PropertyMap *this_00;
  reference ppVar6;
  ElementStyle *this_01;
  Element *in_RSI;
  const_iterator cVar7;
  undefined1 local_c8 [8];
  String inner_rml;
  pair<Rml::PropertyId,_Rml::Property> *id_property;
  const_iterator __end2;
  const_iterator __begin2;
  PropertyMap *__range2;
  ElementAttributes clone_attributes;
  unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> local_28;
  undefined1 local_19;
  Element *this_local;
  ElementPtr *clone;
  
  local_19 = 0;
  this_local = this;
  ::std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>::
  unique_ptr<Rml::Releaser<Rml::Element>,void>
            ((unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>> *)this);
  if (in_RSI->instancer == (ElementInstancer *)0x0) {
    pSVar3 = GetTagName_abi_cxx11_(in_RSI);
    tag = GetTagName_abi_cxx11_(in_RSI);
    Factory::InstanceElement
              ((Factory *)
               &clone_attributes.m_container.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(Element *)0x0,pSVar3,tag,
               &in_RSI->attributes);
    ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::operator=
              ((unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)this,
               (unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)
               &clone_attributes.m_container.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::~unique_ptr
              ((unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)
               &clone_attributes.m_container.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  else {
    pEVar1 = in_RSI->instancer;
    pSVar3 = GetTagName_abi_cxx11_(in_RSI);
    (*pEVar1->_vptr_ElementInstancer[2])(&local_28,pEVar1,0,pSVar3,&in_RSI->attributes);
    ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::operator=
              ((unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)this,&local_28);
    ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::~unique_ptr(&local_28);
    bVar2 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)this);
    if (bVar2) {
      pEVar4 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::operator->
                         ((unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)this);
      SetInstancer(pEVar4,in_RSI->instancer);
    }
  }
  bVar2 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)this);
  if (bVar2) {
    itlib::
    flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
    ::flat_map((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
                *)&__range2,&in_RSI->attributes);
    itlib::
    flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
    ::erase<char[6]>((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
                      *)&__range2,(char (*) [6])0x716b84);
    itlib::
    flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
    ::erase<char[6]>((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
                      *)&__range2,(char (*) [6])"class");
    pEVar4 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::operator->
                       ((unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)this);
    SetAttributes(pEVar4,(ElementAttributes *)&__range2);
    pEVar5 = GetStyle(in_RSI);
    this_00 = ElementStyle::GetLocalStyleProperties(pEVar5);
    cVar7 = robin_hood::detail::
            Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
            ::begin(this_00);
    __end2.mInfo = (uint8_t *)cVar7.mKeyVals;
    cVar7 = robin_hood::detail::
            Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
            ::end(this_00);
    while( true ) {
      __end2.mKeyVals = (NodePtr)cVar7.mInfo;
      id_property = &(cVar7.mKeyVals)->mData;
      bVar2 = robin_hood::detail::
              Table<true,80ul,Rml::PropertyId,Rml::Property,robin_hood::hash<Rml::PropertyId,void>,std::equal_to<Rml::PropertyId>>
              ::Iter<true>::operator!=((Iter<true> *)&__end2.mInfo,(Iter<true> *)&id_property);
      if (!bVar2) break;
      ppVar6 = robin_hood::detail::
               Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
               ::Iter<true>::operator*((Iter<true> *)&__end2.mInfo);
      pEVar4 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::operator->
                         ((unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)this);
      SetProperty(pEVar4,ppVar6->first,&ppVar6->second);
      robin_hood::detail::
      Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
      ::Iter<true>::operator++((Iter<true> *)&__end2.mInfo);
      cVar7.mInfo = (uint8_t *)__end2.mKeyVals;
      cVar7.mKeyVals = (NodePtr)id_property;
    }
    pEVar4 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::operator->
                       ((unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)this);
    pEVar5 = GetStyle(pEVar4);
    this_01 = GetStyle(in_RSI);
    ElementStyle::GetClassNames_abi_cxx11_((String *)((long)&inner_rml.field_2 + 8),this_01);
    ElementStyle::SetClassNames(pEVar5,(String *)((long)&inner_rml.field_2 + 8));
    ::std::__cxx11::string::~string((string *)(inner_rml.field_2._M_local_buf + 8));
    ::std::__cxx11::string::string((string *)local_c8);
    (*(in_RSI->super_ScriptInterface).super_Releasable._vptr_Releasable[8])
              (in_RSI,(string *)local_c8);
    pEVar4 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::operator->
                       ((unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)this);
    SetInnerRML(pEVar4,(String *)local_c8);
    ::std::__cxx11::string::~string((string *)local_c8);
    itlib::
    flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
    ::~flat_map((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
                 *)&__range2);
  }
  return (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)
         (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)this;
}

Assistant:

ElementPtr Element::Clone() const
{
	ElementPtr clone;

	if (instancer)
	{
		clone = instancer->InstanceElement(nullptr, GetTagName(), attributes);
		if (clone)
			clone->SetInstancer(instancer);
	}
	else
		clone = Factory::InstanceElement(nullptr, GetTagName(), GetTagName(), attributes);

	if (clone)
	{
		// Copy over the attributes. The 'style' and 'class' attributes are skipped because inline styles and class names are copied manually below.
		// This is necessary in case any properties or classes have been set manually, in which case the 'style' and 'class' attributes are out of
		// sync with the used style and active classes.
		ElementAttributes clone_attributes = attributes;
		clone_attributes.erase("style");
		clone_attributes.erase("class");
		clone->SetAttributes(clone_attributes);

		for (auto& id_property : GetStyle()->GetLocalStyleProperties())
			clone->SetProperty(id_property.first, id_property.second);

		clone->GetStyle()->SetClassNames(GetStyle()->GetClassNames());

		String inner_rml;
		GetInnerRML(inner_rml);

		clone->SetInnerRML(inner_rml);
	}

	return clone;
}